

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeMemoryModelInstruction(UpgradeMemoryModel *this)

{
  IRContext *pIVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Op local_f8;
  uint local_f4;
  IRContext *local_f0;
  long *local_e8;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_e0;
  int local_d4;
  initializer_list<spvtools::opt::Operand> local_d0;
  Operand local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  SmallVector<unsigned_int,_2UL> local_78;
  string extension;
  
  pIVar1 = (this->super_Pass).context_;
  local_e0._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (((pIVar1->module_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
         _M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->memory_model_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t;
  local_f0 = (IRContext *)((ulong)local_f0 & 0xffffffff00000000);
  local_f8 = OpNop;
  local_e8 = (long *)CONCAT44(local_e8._4_4_,0x11);
  local_f4 = 0x14e1;
  init_list._M_len = 1;
  init_list._M_array = &local_f4;
  local_d0._M_array = (iterator)pIVar1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78,init_list);
  local_c0.type = SPV_OPERAND_TYPE_CAPABILITY;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0.words,&local_78);
  extension._M_dataplus._M_p = (pointer)&local_c0;
  extension._M_string_length = 1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&words,(IRContext **)&local_d0,(Op *)&local_e8,(int *)&local_f0,
             (int *)&local_f8,(initializer_list<spvtools::opt::Operand> *)&extension);
  IRContext::AddCapability
            (pIVar1,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&words);
  if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + 8))();
  }
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extension,"SPV_KHR_vulkan_memory_model",(allocator<char> *)&local_c0);
  utils::MakeVector(&words,&extension);
  pIVar1 = (this->super_Pass).context_;
  local_f8 = OpExtension;
  local_f4 = 0;
  local_d4 = 0;
  local_f0 = pIVar1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78,&words);
  local_c0.type = SPV_OPERAND_TYPE_LITERAL_STRING;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0.words,&local_78);
  local_d0._M_len = 1;
  local_d0._M_array = &local_c0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_e8,&local_f0,&local_f8,(int *)&local_f4,&local_d4,&local_d0);
  IRContext::AddExtension
            (pIVar1,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&local_e8);
  if (local_e8 != (long *)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_e8 = (long *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78);
  local_78._vptr_SmallVector._0_4_ = 3;
  init_list_00._M_len = 1;
  init_list_00._M_array = (iterator)&local_78;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&local_c0,init_list_00);
  Instruction::SetInOperand
            ((Instruction *)
             local_e0._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,1,
             (OperandData *)&local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&local_c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeMemoryModelInstruction() {
  // Overall changes necessary:
  // 1. Add the OpExtension.
  // 2. Add the OpCapability.
  // 3. Modify the memory model.
  Instruction* memory_model = get_module()->GetMemoryModel();
  context()->AddCapability(MakeUnique<Instruction>(
      context(), spv::Op::OpCapability, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_CAPABILITY,
           {uint32_t(spv::Capability::VulkanMemoryModelKHR)}}}));
  const std::string extension = "SPV_KHR_vulkan_memory_model";
  std::vector<uint32_t> words = spvtools::utils::MakeVector(extension);
  context()->AddExtension(
      MakeUnique<Instruction>(context(), spv::Op::OpExtension, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_LITERAL_STRING, words}}));
  memory_model->SetInOperand(1u, {uint32_t(spv::MemoryModel::VulkanKHR)});
}